

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall
pybind11::detail::accessor<pybind11::detail::accessor_policies::generic_item>::operator=
          (accessor<pybind11::detail::accessor_policies::generic_item> *this,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *value)

{
  handle obj;
  handle key;
  handle local_20;
  
  obj.m_ptr = (this->obj).m_ptr;
  key.m_ptr = (this->key).super_handle.m_ptr;
  object_or_cast<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_&,_0>
            ((detail *)&local_20,value);
  accessor_policies::generic_item::set(obj,key,local_20);
  object::~object((object *)&local_20);
  return;
}

Assistant:

void operator=(T &&value) && {
        Policy::set(obj, key, object_or_cast(std::forward<T>(value)));
    }